

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

bool Diligent::IsMultisample(Compiler *Compiler,Resource *Res)

{
  SPIRType *pSVar1;
  SPIRType *type;
  Resource *Res_local;
  Compiler *Compiler_local;
  
  pSVar1 = diligent_spirv_cross::Compiler::get_type(Compiler,(TypeID)(Res->type_id).id);
  if ((pSVar1->basetype == Image) || (pSVar1->basetype == SampledImage)) {
    Compiler_local._7_1_ = (bool)((pSVar1->image).ms & 1);
  }
  else {
    Compiler_local._7_1_ = false;
  }
  return Compiler_local._7_1_;
}

Assistant:

static bool IsMultisample(const diligent_spirv_cross::Compiler& Compiler,
                          const diligent_spirv_cross::Resource& Res)
{
    const auto& type = Compiler.get_type(Res.type_id);
    if (type.basetype == diligent_spirv_cross::SPIRType::BaseType::Image ||
        type.basetype == diligent_spirv_cross::SPIRType::BaseType::SampledImage)
    {
        return type.image.ms;
    }
    else
    {
        return RESOURCE_DIM_UNDEFINED;
    }
}